

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

void Gia_ManHighLightFlopLogic(Gia_Man_t *p)

{
  ulong uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int local_1c;
  Gia_Obj_t *pGStack_18;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  local_1c = 0;
  while( true ) {
    iVar2 = Gia_ManPiNum(p);
    bVar4 = false;
    if (local_1c < iVar2) {
      pGStack_18 = Gia_ManCi(p,local_1c);
      bVar4 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    *(ulong *)pGStack_18 = *(ulong *)pGStack_18 & 0xffffffffbfffffff;
    local_1c = local_1c + 1;
  }
  local_1c = 0;
  while( true ) {
    iVar2 = Gia_ManRegNum(p);
    bVar4 = false;
    if (local_1c < iVar2) {
      iVar2 = Gia_ManPiNum(p);
      pGStack_18 = Gia_ManCi(p,iVar2 + local_1c);
      bVar4 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    *(ulong *)pGStack_18 = *(ulong *)pGStack_18 & 0xffffffffbfffffff | 0x40000000;
    local_1c = local_1c + 1;
  }
  local_1c = 0;
  while( true ) {
    bVar4 = false;
    if (local_1c < p->nObjs) {
      pGStack_18 = Gia_ManObj(p,local_1c);
      bVar4 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar2 = Gia_ObjIsAnd(pGStack_18);
    if (iVar2 != 0) {
      pGVar3 = Gia_ObjFanin0(pGStack_18);
      uVar1 = *(ulong *)pGVar3;
      pGVar3 = Gia_ObjFanin1(pGStack_18);
      *(ulong *)pGStack_18 =
           *(ulong *)pGStack_18 & 0xffffffffbfffffff |
           (ulong)((uint)(uVar1 >> 0x1e) & 1 | (uint)(*(ulong *)pGVar3 >> 0x1e) & 1) << 0x1e;
    }
    local_1c = local_1c + 1;
  }
  local_1c = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->vCos);
    bVar4 = false;
    if (local_1c < iVar2) {
      pGStack_18 = Gia_ManCo(p,local_1c);
      bVar4 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    pGVar3 = Gia_ObjFanin0(pGStack_18);
    *(ulong *)pGStack_18 =
         *(ulong *)pGStack_18 & 0xffffffffbfffffff |
         (ulong)((uint)(*(ulong *)pGVar3 >> 0x1e) & 1) << 0x1e;
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void Gia_ManHighLightFlopLogic( Gia_Man_t * p )
{
    Gia_Obj_t * pObj; int i;
    Gia_ManForEachPi( p, pObj, i )
        pObj->fMark0 = 0;
    Gia_ManForEachRo( p, pObj, i )
        pObj->fMark0 = 1;
    Gia_ManForEachAnd( p, pObj, i )
        pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 | Gia_ObjFanin1(pObj)->fMark0;
    Gia_ManForEachCo( p, pObj, i )
        pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0;
}